

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O1

bool __thiscall AmsConnection::ReceiveNotification(AmsConnection *this,AoEHeader *header)

{
  RingBuffer *this_00;
  uint8_t *puVar1;
  ostream *poVar2;
  ssize_t sVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  long lVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  SharedDispatcher dispatcher;
  stringstream stream;
  string local_1e8;
  undefined1 local_1c8 [16];
  uint16_t local_1b8;
  char local_1b6 [14];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1b8 = header->leTargetPort;
  local_1b6._0_8_ = *(undefined8 *)&header->sourceNetId;
  DispatcherListGet((AmsConnection *)local_1c8,(VirtualConnection *)this);
  if ((NotificationDispatcher *)local_1c8._0_8_ == (NotificationDispatcher *)0x0) {
    ReceiveJunk(this,(ulong)header->leLength);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"No dispatcher found for notification",0x24);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1e8);
  }
  else {
    this_00 = (RingBuffer *)(local_1c8._0_8_ + 0x20);
    uVar6 = header->leLength;
    puVar11 = (uint8_t *)(ulong)uVar6;
    puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
    puVar4 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->read;
    uVar5 = ~(ulong)puVar9;
    if (puVar4 <= puVar9) {
      uVar5 = this_00->dataSize + uVar5;
    }
    puVar4 = puVar4 + uVar5;
    bVar7 = puVar11 + 4 <= puVar4;
    if (puVar11 + 4 <= puVar4) {
      lVar8 = 0;
      do {
        *((RingBuffer *)(local_1c8._0_8_ + 0x20))->write = (uint8_t)(uVar6 >> ((byte)lVar8 & 0x1f));
        RingBuffer::Write(this_00,1);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
      puVar4 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->read;
      if (puVar9 < puVar4) {
        puVar4 = puVar4 + ~(ulong)puVar9;
      }
      else {
        puVar10 = (((RingBuffer *)(local_1c8._0_8_ + 0x20))->data)._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        puVar4 = puVar10 + ((RingBuffer *)(local_1c8._0_8_ + 0x20))->dataSize +
                 -(long)(puVar9 + (puVar10 == puVar4));
      }
      puVar9 = puVar11;
      if (puVar4 < puVar11) {
        do {
          if (puVar4 != (uint8_t *)0x0) {
            puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
            puVar10 = puVar4;
            do {
              sVar3 = Socket::read(&(this->socket).super_Socket,(int)puVar9,puVar10,0);
              puVar9 = puVar9 + sVar3;
              puVar10 = puVar10 + -sVar3;
            } while (puVar10 != (uint8_t *)0x0);
          }
          RingBuffer::Write(this_00,(size_t)puVar4);
          puVar9 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
          puVar10 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->read;
          if (puVar9 < puVar10) {
            puVar10 = puVar10 + ~(ulong)puVar9;
          }
          else {
            puVar1 = (((RingBuffer *)(local_1c8._0_8_ + 0x20))->data)._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
            puVar10 = puVar1 + ((RingBuffer *)(local_1c8._0_8_ + 0x20))->dataSize +
                      -(long)(puVar9 + (puVar1 == puVar10));
          }
          uVar6 = (int)puVar11 - (int)puVar4;
          puVar11 = (uint8_t *)(ulong)uVar6;
          puVar9 = (uint8_t *)(ulong)uVar6;
          puVar4 = puVar10;
        } while (puVar10 < puVar9);
      }
      if (uVar6 != 0) {
        puVar4 = ((RingBuffer *)(local_1c8._0_8_ + 0x20))->write;
        puVar11 = puVar9;
        do {
          sVar3 = Socket::read(&(this->socket).super_Socket,(int)puVar4,puVar11,0);
          puVar4 = puVar4 + sVar3;
          puVar11 = puVar11 + -sVar3;
        } while (puVar11 != (uint8_t *)0x0);
      }
      RingBuffer::Write(this_00,(size_t)puVar9);
      NotificationDispatcher::Notify((NotificationDispatcher *)local_1c8._0_8_);
      goto LAB_0012a01d;
    }
    ReceiveJunk(this,(size_t)puVar11);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"port ",5);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," receive buffer was full",0x18);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  bVar7 = false;
LAB_0012a01d:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  return bVar7;
}

Assistant:

bool AmsConnection::ReceiveNotification(const AoEHeader& header)
{
    const auto dispatcher = DispatcherListGet(VirtualConnection { header.targetPort(), header.sourceAms() });
    if (!dispatcher) {
        ReceiveJunk(header.length());
        LOG_WARN("No dispatcher found for notification");
        return false;
    }

    auto& ring = dispatcher->ring;
    auto bytesLeft = header.length();
    if (bytesLeft + sizeof(bytesLeft) > ring.BytesFree()) {
        ReceiveJunk(bytesLeft);
        LOG_WARN("port " << std::dec << header.targetPort() << " receive buffer was full");
        return false;
    }

    /** store AoEHeader.length() in ring buffer to support notification parsing */
    for (size_t i = 0; i < sizeof(bytesLeft); ++i) {
        *ring.write = (bytesLeft >> (8 * i)) & 0xFF;
        ring.Write(1);
    }

    auto chunk = ring.WriteChunk();
    while (bytesLeft > chunk) {
        Receive(ring.write, chunk);
        ring.Write(chunk);
        // We already checked bytesLeft > chunk, well it was not obvious enough for MSVC
        bytesLeft -= static_cast<decltype(bytesLeft)>(chunk);
        chunk = ring.WriteChunk();
    }
    Receive(ring.write, bytesLeft);
    ring.Write(bytesLeft);
    dispatcher->Notify();
    return true;
}